

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall HighFreqSub::HighFreqSub(HighFreqSub *this,HighFreqDataType *hf,SubType type)

{
  undefined4 in_EDX;
  undefined8 *in_RDI;
  HighFreqDataType *this_00;
  HighFreqDataType *in_stack_ffffffffffffff58;
  HighFreqDataType *in_stack_ffffffffffffff60;
  HighFreqDataType *in_stack_ffffffffffffff80;
  HighFreqSub *in_stack_ffffffffffffff88;
  
  *in_RDI = &PTR__HighFreqSub_005d5e00;
  this_00 = (HighFreqDataType *)(in_RDI + 1);
  HighFreqDataType::HighFreqDataType(in_stack_ffffffffffffff60);
  in_RDI[0x13] = 0;
  in_RDI[0x15] = 0;
  *(undefined4 *)(in_RDI + 0x16) = in_EDX;
  HighFreqDataType::HighFreqDataType(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  registerDataType(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  HighFreqDataType::~HighFreqDataType(this_00);
  return;
}

Assistant:

HighFreqSub::HighFreqSub(HighFreqDataType hf, SubType type)
    : actor(NULL),
      sub(NULL),
//      registered(false),
      sockType(type)
{
    registerDataType(hf);
}